

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetCollectLinkLanguages::Visit(cmTargetCollectLinkLanguages *this,cmLinkItem *item)

{
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *this_00;
  MessageType t;
  bool bVar1;
  PolicyStatus PVar2;
  long lVar3;
  cmLocalGenerator *pcVar4;
  ostream *poVar5;
  string *psVar6;
  cmake *this_01;
  reference __obj;
  reference item_00;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_298;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_290;
  const_iterator li_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  const_iterator li;
  cmLinkInterface *iface;
  cmListFileBacktrace local_238;
  string local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream e;
  ostream local_198;
  MessageType local_20;
  byte local_19;
  MessageType messageType;
  bool noMessage;
  cmLinkItem *item_local;
  cmTargetCollectLinkLanguages *this_local;
  
  _messageType = item;
  item_local = (cmLinkItem *)this;
  if (item->Target == (cmGeneratorTarget *)0x0) {
    lVar3 = std::__cxx11::string::find((char *)item,0x98fb8f);
    if (lVar3 != -1) {
      local_19 = 0;
      local_20 = FATAL_ERROR;
      std::__cxx11::stringstream::stringstream(local_1a8);
      pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
      PVar2 = cmLocalGenerator::GetPolicyStatus(pcVar4,CMP0028);
      if (PVar2 == OLD) {
        local_19 = 1;
      }
      else if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x1c,id);
        poVar5 = std::operator<<(&local_198,(string *)&local_1d8);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&local_1d8);
        local_20 = AUTHOR_WARNING;
      }
      if ((local_19 & 1) == 0) {
        poVar5 = std::operator<<(&local_198,"Target \"");
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"\" links to target \"");
        poVar5 = std::operator<<(poVar5,(string *)_messageType);
        std::operator<<(poVar5,
                        "\" but the target was not found.  Perhaps a find_package() call is missing for an IMPORTED target, or an ALIAS target is missing?"
                       );
        pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
        this_01 = cmLocalGenerator::GetCMakeInstance(pcVar4);
        t = local_20;
        std::__cxx11::stringstream::str();
        cmGeneratorTarget::GetBacktrace(&local_238,this->Target);
        cmake::IssueMessage(this_01,t,&local_1f8,&local_238,false);
        cmListFileBacktrace::~cmListFileBacktrace(&local_238);
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      std::__cxx11::stringstream::~stringstream(local_1a8);
    }
  }
  else {
    pVar7 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(&this->Visited,&item->Target);
    if ((((pVar7.second ^ 0xffU) & 1) == 0) &&
       (li._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmGeneratorTarget::GetLinkInterface
                       (_messageType->Target,&this->Config,this->HeadTarget),
       (cmLinkInterface *)li._M_current != (cmLinkInterface *)0x0)) {
      local_268._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&((cmLinkInterface *)li._M_current)->Languages);
      while( true ) {
        local_270._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&(li._M_current)->field_2 + 8));
        bVar1 = __gnu_cxx::operator!=(&local_268,&local_270);
        if (!bVar1) break;
        this_00 = this->Languages;
        __obj = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_268);
        cmsys::
        hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)&li_1,this_00,__obj);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_268);
      }
      local_290._M_current =
           (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)li._M_current);
      while( true ) {
        local_298._M_current =
             (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)li._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_290,&local_298);
        if (!bVar1) break;
        item_00 = __gnu_cxx::
                  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                  ::operator*(&local_290);
        Visit(this,item_00);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&local_290);
      }
    }
  }
  return;
}

Assistant:

void Visit(cmLinkItem const& item)
    {
    if(!item.Target)
      {
      if(item.find("::") != std::string::npos)
        {
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        std::stringstream e;
        switch(this->Target->GetLocalGenerator()
               ->GetPolicyStatus(cmPolicies::CMP0028))
          {
          case cmPolicies::WARN:
            {
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0028) << "\n";
            messageType = cmake::AUTHOR_WARNING;
            }
            break;
          case cmPolicies::OLD:
            noMessage = true;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            // Issue the fatal message.
            break;
          }

        if(!noMessage)
          {
          e << "Target \"" << this->Target->GetName()
            << "\" links to target \"" << item
            << "\" but the target was not found.  Perhaps a find_package() "
            "call is missing for an IMPORTED target, or an ALIAS target is "
            "missing?";
          this->Target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
            messageType, e.str(), this->Target->GetBacktrace());
          }
        }
      return;
      }
    if(!this->Visited.insert(item.Target).second)
      {
      return;
      }
    cmLinkInterface const* iface =
      item.Target->GetLinkInterface(this->Config, this->HeadTarget);
    if(!iface) { return; }

    for(std::vector<std::string>::const_iterator
          li = iface->Languages.begin(); li != iface->Languages.end(); ++li)
      {
      this->Languages.insert(*li);
      }

    for(std::vector<cmLinkItem>::const_iterator
          li = iface->Libraries.begin(); li != iface->Libraries.end(); ++li)
      {
      this->Visit(*li);
      }
    }